

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O3

void get_light(vec3 *dir_list,vec3 *c_list,int light_n,float *dir,float *c)

{
  *dir = dir_list[light_n][0];
  dir[1] = dir_list[light_n][1];
  dir[2] = dir_list[light_n][2];
  *c = c_list[light_n][0];
  c[1] = c_list[light_n][1];
  c[2] = c_list[light_n][2];
  return;
}

Assistant:

void get_light(const vec3 dir_list[], const vec3 c_list[], const int light_n, vec3 dir, vec3 c){
    dir[0] = dir_list[light_n][0];
    dir[1] = dir_list[light_n][1];
    dir[2] = dir_list[light_n][2];
    c[0] = c_list[light_n][0];
    c[1] = c_list[light_n][1];
    c[2] = c_list[light_n][2];
}